

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v6::internal::
basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>
::
write_padded<fmt::v6::internal::basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>::padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>::int_writer<unsigned_int,fmt::v6::basic_format_specs<char>>::dec_writer>>
          (basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>
           *this,format_specs *specs,
          padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>::int_writer<unsigned_int,_fmt::v6::basic_format_specs<char>_>::dec_writer>
          *f)

{
  byte bVar1;
  undefined8 *puVar2;
  long lVar3;
  byte bVar4;
  char __tmp;
  char *pcVar5;
  size_t __len_1;
  ulong uVar6;
  size_t __len;
  size_t __n;
  ulong uVar7;
  char *local_48;
  ulong local_40;
  padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>::int_writer<unsigned_int,_fmt::v6::basic_format_specs<char>_>::dec_writer>
  *local_38;
  
  local_40 = (ulong)(uint)specs->width;
  uVar7 = f->size_;
  __n = local_40 - uVar7;
  if (local_40 < uVar7 || __n == 0) {
    puVar2 = *(undefined8 **)this;
    lVar3 = puVar2[2];
    uVar7 = uVar7 + lVar3;
    if ((ulong)puVar2[3] < uVar7) {
      (**(code **)*puVar2)(puVar2,uVar7);
    }
    puVar2[2] = uVar7;
    local_48 = (char *)(lVar3 + puVar2[1]);
    padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>::int_writer<unsigned_int,fmt::v6::basic_format_specs<char>>::dec_writer>
    ::operator()((padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>::int_writer<unsigned_int,fmt::v6::basic_format_specs<char>>::dec_writer>
                  *)f,&local_48);
    return;
  }
  puVar2 = *(undefined8 **)this;
  lVar3 = puVar2[2];
  uVar6 = lVar3 + local_40;
  local_38 = f;
  if ((ulong)puVar2[3] < uVar6) {
    (**(code **)*puVar2)(puVar2,uVar6);
  }
  puVar2[2] = uVar6;
  local_48 = (char *)(lVar3 + puVar2[1]);
  bVar1 = (specs->fill).data_[0];
  bVar4 = specs->field_0x9 & 0xf;
  if (bVar4 == 3) {
    uVar6 = __n >> 1;
    pcVar5 = local_48;
    if (1 < __n) {
      pcVar5 = local_48 + uVar6;
      memset(local_48,(uint)bVar1,uVar6);
    }
    local_48 = pcVar5;
    padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>::int_writer<unsigned_int,fmt::v6::basic_format_specs<char>>::dec_writer>
    ::operator()((padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>::int_writer<unsigned_int,fmt::v6::basic_format_specs<char>>::dec_writer>
                  *)local_38,&local_48);
    if (local_40 == uVar7) {
      return;
    }
    __n = __n - uVar6;
  }
  else {
    if (bVar4 == 2) {
      pcVar5 = local_48;
      if (local_40 != uVar7) {
        pcVar5 = local_48 + __n;
        memset(local_48,(uint)bVar1,__n);
      }
      local_48 = pcVar5;
      padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>::int_writer<unsigned_int,fmt::v6::basic_format_specs<char>>::dec_writer>
      ::operator()((padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>::int_writer<unsigned_int,fmt::v6::basic_format_specs<char>>::dec_writer>
                    *)local_38,&local_48);
      return;
    }
    padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>::int_writer<unsigned_int,fmt::v6::basic_format_specs<char>>::dec_writer>
    ::operator()((padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>::int_writer<unsigned_int,fmt::v6::basic_format_specs<char>>::dec_writer>
                  *)local_38,&local_48);
    if (local_40 == uVar7) {
      return;
    }
  }
  memset(local_48,(uint)bVar1,__n);
  return;
}

Assistant:

void write_padded(const format_specs& specs, F&& f) {
    // User-perceived width (in code points).
    unsigned width = to_unsigned(specs.width);
    size_t size = f.size();  // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points) return f(reserve(size));
    auto&& it = reserve(width + (size - num_code_points));
    char_type fill = specs.fill[0];
    std::size_t padding = width - num_code_points;
    if (specs.align == align::right) {
      it = std::fill_n(it, padding, fill);
      f(it);
    } else if (specs.align == align::center) {
      std::size_t left_padding = padding / 2;
      it = std::fill_n(it, left_padding, fill);
      f(it);
      it = std::fill_n(it, padding - left_padding, fill);
    } else {
      f(it);
      it = std::fill_n(it, padding, fill);
    }
  }